

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O3

ValueCallback * __thiscall
SNMPAgent::addReadWriteStringHandler
          (SNMPAgent *this,char *oid,char **value,size_t max_len,bool isSettable,
          bool overwritePrefix)

{
  SortableOIDType *pSVar1;
  ValueCallback *pVVar2;
  
  if ((value != (char **)0x0) && (*value != (char *)0x0)) {
    pSVar1 = buildOIDWithPrefix(this,oid,overwritePrefix);
    if (pSVar1 != (SortableOIDType *)0x0) {
      pVVar2 = (ValueCallback *)operator_new(0x28);
      pVVar2->OID = pSVar1;
      pVVar2->type = STRING;
      pVVar2->isSettable = false;
      pVVar2->setOccurred = false;
      pVVar2->_vptr_ValueCallback = (_func_int **)&PTR_buildTypeWithValue_001a1a78;
      pVVar2[1]._vptr_ValueCallback = (_func_int **)value;
      pVVar2[1].OID = (SortableOIDType *)max_len;
      pVVar2 = addHandler(this,pVVar2,isSettable);
      return pVVar2;
    }
  }
  return (ValueCallback *)0x0;
}

Assistant:

ValueCallback* SNMPAgent::addReadWriteStringHandler(const char *oid, char** value, size_t max_len, bool isSettable, bool overwritePrefix){
    if(!value || !*value) return nullptr;

    SortableOIDType* oidType = buildOIDWithPrefix(oid, overwritePrefix);
    if(!oidType) return nullptr;
    return addHandler(new StringCallback(oidType, value, max_len), isSettable);
}